

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::Convolution3DLayerParams::Clear(Convolution3DLayerParams *this)

{
  (this->outputshape_).current_size_ = 0;
  if (this->weights_ != (WeightParams *)0x0) {
    (*(this->weights_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->weights_ = (WeightParams *)0x0;
  if (this->bias_ != (WeightParams *)0x0) {
    (*(this->bias_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->custompaddingfront_ = 0;
  this->custompaddingback_ = 0;
  this->custompaddingtop_ = 0;
  this->custompaddingbottom_ = 0;
  this->dilationheight_ = 0;
  this->dilationwidth_ = 0;
  this->hasbias_ = false;
  this->isdeconvolution_ = false;
  *(undefined2 *)&this->field_0x6a = 0;
  this->paddingtype_ = 0;
  this->stridedepth_ = 0;
  this->strideheight_ = 0;
  this->stridewidth_ = 0;
  this->dilationdepth_ = 0;
  this->ngroups_ = 0;
  this->kerneldepth_ = 0;
  this->kernelheight_ = 0;
  this->kernelwidth_ = 0;
  this->bias_ = (WeightParams *)0x0;
  this->outputchannels_ = 0;
  this->inputchannels_ = 0;
  this->custompaddingleft_ = 0;
  this->custompaddingright_ = 0;
  return;
}

Assistant:

void Convolution3DLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.Convolution3DLayerParams)
  outputshape_.Clear();
  if (GetArenaNoVirtual() == NULL && weights_ != NULL) {
    delete weights_;
  }
  weights_ = NULL;
  if (GetArenaNoVirtual() == NULL && bias_ != NULL) {
    delete bias_;
  }
  bias_ = NULL;
  ::memset(&outputchannels_, 0, reinterpret_cast<char*>(&custompaddingright_) -
    reinterpret_cast<char*>(&outputchannels_) + sizeof(custompaddingright_));
}